

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::_InternalSerializeAllImpl
          (ExtensionSet *this,MessageLite *extendee,uint8_t *target,EpsCopyOutputStream *stream)

{
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  MessageLite *extendee_local;
  ExtensionSet *this_local;
  
  ForEach<google::protobuf::internal::ExtensionSet::_InternalSerializeAllImpl(google::protobuf::MessageLite_const*,unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)const::__0,google::protobuf::internal::ExtensionSet::Prefetch>
            ();
  return target;
}

Assistant:

uint8_t* ExtensionSet::_InternalSerializeAllImpl(
    const MessageLite* extendee, uint8_t* target,
    io::EpsCopyOutputStream* stream) const {
  ForEach(
      [&target, extendee, stream, this](int number, const Extension& ext) {
        target = ext.InternalSerializeFieldWithCachedSizesToArray(
            extendee, this, number, target, stream);
      },
      Prefetch{});
  return target;
}